

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O1

void __thiscall QSizeGrip::mousePressEvent(QSizeGrip *this,QMouseEvent *e)

{
  long lVar1;
  QWidget *this_00;
  QWidgetData *pQVar2;
  undefined8 uVar3;
  bool bVar4;
  char cVar5;
  undefined1 uVar6;
  ScrollBarPolicy SVar7;
  int iVar8;
  ulong uVar9;
  QWindow *pQVar10;
  long *plVar11;
  QAbstractScrollArea *this_01;
  int iVar12;
  undefined4 extraout_EDX;
  uint uVar13;
  int iVar14;
  undefined4 uVar15;
  int iVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  bool bVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar21 [16];
  QRect QVar22;
  QRect QVar23;
  QVariant QStack_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(e + 0x40) == 1) {
    lVar1 = *(long *)&(this->super_QWidget).field_0x8;
    do {
      uVar13 = (((this->super_QWidget).data)->window_flags).
               super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i;
      if (((uVar13 & 1) != 0) || ((uVar13 & 0xff) == 0x12)) break;
      this = *(QSizeGrip **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10);
    } while (&this->super_QWidget != (QWidget *)0x0);
    dVar19 = (double)QEventPoint::globalPosition();
    auVar21._0_8_ =
         (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM1_Qa;
    auVar21._8_8_ = (double)((ulong)dVar19 & 0x8000000000000000 | 0x3fe0000000000000) + dVar19;
    auVar21 = minpd(_DAT_0066f5d0,auVar21);
    auVar20._8_8_ = -(ulong)(-2147483648.0 < auVar21._8_8_);
    auVar20._0_8_ = -(ulong)(-2147483648.0 < auVar21._0_8_);
    uVar13 = movmskpd(extraout_EDX,auVar20);
    uVar17 = 0x8000000000000000;
    if ((uVar13 & 1) != 0) {
      uVar17 = (ulong)(uint)(int)auVar21._0_8_ << 0x20;
    }
    uVar9 = 0x80000000;
    if ((uVar13 & 2) != 0) {
      uVar9 = (ulong)(uint)(int)auVar21._8_8_;
    }
    *(ulong *)(lVar1 + 0x254) = uVar9 | uVar17;
    *(undefined1 *)(lVar1 + 0x27c) = 1;
    uVar3 = *(undefined8 *)&(((this->super_QWidget).data)->crect).x2;
    *(undefined8 *)(lVar1 + 0x25c) = *(undefined8 *)&((this->super_QWidget).data)->crect;
    *(undefined8 *)(lVar1 + 0x264) = uVar3;
    *(undefined1 *)(lVar1 + 0x290) = 0;
    if (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      pQVar10 = QWidget::windowHandle(&this->super_QWidget);
      if ((pQVar10 != (QWindow *)0x0) &&
         (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>
           .super_QFlagsStorage<Qt::WindowType>.i & 0x400) == 0)) {
        bVar4 = QWidget::testAttribute_helper(&this->super_QWidget,WA_DontShowOnScreen);
        if (!bVar4) {
          cVar5 = (**(code **)(*(long *)this + 0x88))(this);
          if (cVar5 == '\0') {
            bVar4 = usePlatformSizeGrip(&this->super_QWidget);
            if (bVar4) {
              QWidget::windowHandle(&this->super_QWidget);
              plVar11 = (long *)QWindow::handle();
              uVar15 = 0;
              if ((ulong)*(uint *)(lVar1 + 0x278) < 4) {
                uVar15 = *(undefined4 *)(&DAT_006ebc10 + (ulong)*(uint *)(lVar1 + 0x278) * 4);
              }
              uVar6 = (**(code **)(*plVar11 + 0x138))(plVar11,uVar15);
              *(undefined1 *)(lVar1 + 0x290) = uVar6;
            }
          }
        }
      }
    }
    if (*(char *)(lVar1 + 0x290) == '\0') {
      if (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>
           .super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
        this_00 = *(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10);
        this_01 = (QAbstractScrollArea *)
                  QMetaObject::cast((QObject *)&QAbstractScrollArea::staticMetaObject);
        if (this_01 == (QAbstractScrollArea *)0x0) {
          bVar18 = true;
          bVar4 = true;
        }
        else {
          SVar7 = QAbstractScrollArea::horizontalScrollBarPolicy(this_01);
          bVar18 = SVar7 == ScrollBarAlwaysOff;
          SVar7 = QAbstractScrollArea::verticalScrollBarPolicy(this_01);
          bVar4 = SVar7 == ScrollBarAlwaysOff;
        }
        QVar22 = QWidget::contentsRect(this_00);
      }
      else {
        (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
                  (&QStack_58,QGuiApplicationPrivate::platform_theme,0x25);
        cVar5 = ::QVariant::toBool();
        ::QVariant::~QVariant(&QStack_58);
        if (cVar5 == '\0') {
          QVar22 = QWidgetPrivate::availableScreenGeometry(&this->super_QWidget);
        }
        else {
          QWidget::screen(&this->super_QWidget);
          QVar22 = (QRect)QScreen::availableVirtualGeometry();
        }
        bVar18 = true;
        bVar4 = true;
      }
      QVar23 = QWidget::frameGeometry(&this->super_QWidget);
      pQVar2 = (this->super_QWidget).data;
      iVar16 = (pQVar2->crect).y1.m_i;
      iVar12 = iVar16 - QVar23.y1.m_i;
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      iVar16 = (QVar23.y2.m_i.m_i + iVar16) - (QVar23.y1.m_i.m_i + (pQVar2->crect).y2.m_i + iVar12);
      if (iVar16 < 1) {
        iVar16 = 0;
      }
      iVar14 = ((QVar23.x2.m_i.m_i - QVar23.x1.m_i) - (pQVar2->crect).x2.m_i) +
               (pQVar2->crect).x1.m_i;
      iVar8 = iVar14 / 2;
      if (iVar14 / 2 < 1) {
        iVar8 = 0;
      }
      if ((*(uint *)(lVar1 + 0x278) & 0xfffffffe) == 2) {
        iVar14 = 0x7fffffff;
        if (bVar4) {
          iVar14 = QVar22.y2.m_i.m_i - (iVar16 + *(int *)(lVar1 + 0x268));
        }
      }
      else {
        iVar14 = -0x7fffffff;
        if (bVar4) {
          iVar14 = (iVar12 + QVar22.y1.m_i.m_i) - *(int *)(lVar1 + 0x260);
        }
      }
      *(int *)(lVar1 + 0x274) = iVar14;
      if ((*(uint *)(lVar1 + 0x278) & 0xfffffffd) == 0) {
        if (bVar18) {
          *(int *)(lVar1 + 0x270) = (iVar8 + QVar22.x1.m_i.m_i) - *(int *)(lVar1 + 0x25c);
        }
        else {
          *(undefined4 *)(lVar1 + 0x270) = 0x80000001;
        }
      }
      else if (bVar18) {
        *(int *)(lVar1 + 0x270) = QVar22.x2.m_i.m_i - (iVar8 + *(int *)(lVar1 + 0x264));
      }
      else {
        *(undefined4 *)(lVar1 + 0x270) = 0x7fffffff;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QWidget::mousePressEvent(&this->super_QWidget,e);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSizeGrip::mousePressEvent(QMouseEvent * e)
{
    if (e->button() != Qt::LeftButton) {
        QWidget::mousePressEvent(e);
        return;
    }

    Q_D(QSizeGrip);
    QWidget *tlw = qt_sizegrip_topLevelWidget(this);
    d->p = e->globalPosition().toPoint();
    d->gotMousePress = true;
    d->r = tlw->geometry();

    // Does the platform provide size grip support?
    d->m_platformSizeGrip = false;
    if (tlw->isWindow()
        && tlw->windowHandle()
        && !(tlw->windowFlags() & Qt::X11BypassWindowManagerHint)
        && !tlw->testAttribute(Qt::WA_DontShowOnScreen)
        && !tlw->hasHeightForWidth()
        && usePlatformSizeGrip(tlw)) {
        QPlatformWindow *platformWindow = tlw->windowHandle()->handle();
        const Qt::Edges edges = edgesFromCorner(d->m_corner);
        d->m_platformSizeGrip = platformWindow->startSystemResize(edges);
    }

    if (d->m_platformSizeGrip)
        return;

    // Find available desktop/workspace geometry.
    QRect availableGeometry;
    bool hasVerticalSizeConstraint = true;
    bool hasHorizontalSizeConstraint = true;
    if (tlw->isWindow()) {
        if (QGuiApplicationPrivate::platformTheme()->themeHint(QPlatformTheme::InteractiveResizeAcrossScreens).toBool())
            availableGeometry = tlw->screen()->availableVirtualGeometry();
        else
            availableGeometry = QWidgetPrivate::availableScreenGeometry(tlw);
    }
    else {
        const QWidget *tlwParent = tlw->parentWidget();
        // Check if tlw is inside QAbstractScrollArea/QScrollArea.
        // If that's the case tlw->parentWidget() will return the viewport
        // and tlw->parentWidget()->parentWidget() will return the scroll area.
#if QT_CONFIG(scrollarea)
        QAbstractScrollArea *scrollArea = qobject_cast<QAbstractScrollArea *>(tlwParent->parentWidget());
        if (scrollArea) {
            hasHorizontalSizeConstraint = scrollArea->horizontalScrollBarPolicy() == Qt::ScrollBarAlwaysOff;
            hasVerticalSizeConstraint = scrollArea->verticalScrollBarPolicy() == Qt::ScrollBarAlwaysOff;
        }
#endif // QT_CONFIG(scrollarea)
        availableGeometry = tlwParent->contentsRect();
    }

    // Find frame geometries, title bar height, and decoration sizes.
    const QRect frameGeometry = tlw->frameGeometry();
    const int titleBarHeight = qMax(tlw->geometry().y() - frameGeometry.y(), 0);
    const int bottomDecoration = qMax(frameGeometry.height() - tlw->height() - titleBarHeight, 0);
    const int leftRightDecoration = qMax((frameGeometry.width() - tlw->width()) / 2, 0);

    // Determine dyMax depending on whether the sizegrip is at the bottom
    // of the widget or not.
    if (d->atBottom()) {
        if (hasVerticalSizeConstraint)
            d->dyMax = availableGeometry.bottom() - d->r.bottom() - bottomDecoration;
        else
            d->dyMax = INT_MAX;
    } else {
        if (hasVerticalSizeConstraint)
            d->dyMax = availableGeometry.y() - d->r.y() + titleBarHeight;
        else
            d->dyMax = -INT_MAX;
    }

    // In RTL mode, the size grip is to the left; find dxMax from the desktop/workspace
    // geometry, the size grip geometry and the width of the decoration.
    if (d->atLeft()) {
        if (hasHorizontalSizeConstraint)
            d->dxMax = availableGeometry.x() - d->r.x() + leftRightDecoration;
        else
            d->dxMax = -INT_MAX;
    } else {
        if (hasHorizontalSizeConstraint)
            d->dxMax = availableGeometry.right() - d->r.right() - leftRightDecoration;
        else
            d->dxMax = INT_MAX;
    }
}